

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

char * __thiscall cmsys::RegExpCompile::regpiece(RegExpCompile *this,int *flagp)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  int flags;
  uint local_2c;
  
  pcVar3 = regatom(this,(int *)&local_2c);
  if (pcVar3 == (char *)0x0) {
    return (char *)0x0;
  }
  bVar1 = *this->regparse;
  if ((0x3f < (ulong)bVar1) || ((0x80000c0000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
    *flagp = local_2c;
    return pcVar3;
  }
  if (bVar1 != 0x3f && (local_2c & 1) == 0) {
    pcVar3 = "RegularExpression::compile() : *+ operand could be empty.";
    goto LAB_001296fa;
  }
  *flagp = (uint)(bVar1 != 0x2b) * 3 + 1;
  pcVar6 = pcVar3;
  if (bVar1 == 0x2a) {
    pcVar5 = this->regcode;
    if ((local_2c & 2) == 0) {
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        this->regcode = pcVar5 + 3;
        for (; pcVar3 < pcVar5; pcVar5 = pcVar5 + -1) {
          pcVar5[2] = pcVar5[-1];
        }
        pcVar3[0] = '\x06';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
      }
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\a';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      if (pcVar3 != &regdummy) {
        if (*pcVar3 == '\x06') {
          regtail(pcVar3 + 3,pcVar5);
        }
        if ((pcVar3 != &regdummy) && (*pcVar3 == '\x06')) {
          regtail(pcVar3 + 3,pcVar3);
        }
      }
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\x06';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      regtail(pcVar3,pcVar5);
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) goto LAB_001296cc;
LAB_001295fb:
      pcVar5[0] = '\t';
      pcVar5[1] = '\0';
      pcVar5[2] = '\0';
      this->regcode = pcVar5 + 3;
LAB_001296d4:
      regtail(pcVar6,pcVar5);
    }
    else if (pcVar5 == &regdummy) {
LAB_00129569:
      this->regsize = this->regsize + 3;
    }
    else {
      this->regcode = pcVar5 + 3;
      for (; pcVar3 < pcVar5; pcVar5 = pcVar5 + -1) {
        pcVar5[2] = pcVar5[-1];
      }
      pcVar3[0] = '\n';
      pcVar3[1] = '\0';
LAB_00129560:
      pcVar3[2] = '\0';
    }
  }
  else {
    if (bVar1 == 0x2b) {
      pcVar5 = this->regcode;
      if ((local_2c & 2) != 0) {
        if (pcVar5 == &regdummy) goto LAB_00129569;
        this->regcode = pcVar5 + 3;
        for (; pcVar3 < pcVar5; pcVar5 = pcVar5 + -1) {
          pcVar5[2] = pcVar5[-1];
        }
        pcVar3[0] = '\v';
        pcVar3[1] = '\0';
        goto LAB_00129560;
      }
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\x06';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      regtail(pcVar3,pcVar5);
      pcVar2 = this->regcode;
      if (pcVar2 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar2[0] = '\a';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        this->regcode = pcVar2 + 3;
      }
      regtail(pcVar2,pcVar3);
      pcVar2 = this->regcode;
      if (pcVar2 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar2[0] = '\x06';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        this->regcode = pcVar2 + 3;
      }
      regtail(pcVar5,pcVar2);
      pcVar5 = this->regcode;
      if (pcVar5 != &regdummy) goto LAB_001295fb;
LAB_001296cc:
      this->regsize = this->regsize + 3;
      goto LAB_001296d4;
    }
    if (bVar1 == 0x3f) {
      pcVar6 = this->regcode;
      if (pcVar6 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        this->regcode = pcVar6 + 3;
        for (; pcVar3 < pcVar6; pcVar6 = pcVar6 + -1) {
          pcVar6[2] = pcVar6[-1];
        }
        pcVar3[0] = '\x06';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
      }
      pcVar6 = this->regcode;
      if (pcVar6 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar6[0] = '\x06';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        this->regcode = pcVar6 + 3;
      }
      regtail(pcVar3,pcVar6);
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\t';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      regtail(pcVar3,pcVar5);
      if ((pcVar3 != &regdummy) && (*pcVar3 == '\x06')) {
        pcVar6 = pcVar3 + 3;
        goto LAB_001296d4;
      }
    }
  }
  pcVar6 = this->regparse;
  this->regparse = pcVar6 + 1;
  uVar4 = (ulong)(byte)pcVar6[1];
  if (0x3f < uVar4) {
    return pcVar3;
  }
  if ((0x80000c0000000000U >> (uVar4 & 0x3f) & 1) == 0) {
    return pcVar3;
  }
  pcVar3 = "RegularExpression::compile(): Nested *?+.";
LAB_001296fa:
  puts(pcVar3);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regpiece(int* flagp)
{
  char* ret;
  char op;
  char* next;
  int flags;

  ret = regatom(&flags);
  if (ret == nullptr)
    return (nullptr);

  op = *regparse;
  if (!ISMULT(op)) {
    *flagp = flags;
    return (ret);
  }

  if (!(flags & HASWIDTH) && op != '?') {
    // RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
    printf("RegularExpression::compile() : *+ operand could be empty.\n");
    return nullptr;
  }
  *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

  if (op == '*' && (flags & SIMPLE))
    reginsert(STAR, ret);
  else if (op == '*') {
    // Emit x* as (x&|), where & means "self".
    reginsert(BRANCH, ret);         // Either x
    regoptail(ret, regnode(BACK));  // and loop
    regoptail(ret, ret);            // back
    regtail(ret, regnode(BRANCH));  // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '+' && (flags & SIMPLE))
    reginsert(PLUS, ret);
  else if (op == '+') {
    // Emit x+ as x(&|), where & means "self".
    next = regnode(BRANCH); // Either
    regtail(ret, next);
    regtail(regnode(BACK), ret);    // loop back
    regtail(next, regnode(BRANCH)); // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '?') {
    // Emit x? as (x|)
    reginsert(BRANCH, ret);        // Either x
    regtail(ret, regnode(BRANCH)); // or
    next = regnode(NOTHING);       // null.
    regtail(ret, next);
    regoptail(ret, next);
  }
  regparse++;
  if (ISMULT(*regparse)) {
    // RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
    printf("RegularExpression::compile(): Nested *?+.\n");
    return nullptr;
  }
  return (ret);
}